

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

void __thiscall dxil_spv::CFGStructurizer::duplicate_node(CFGStructurizer *this,CFGNode *node)

{
  uint32_t uVar1;
  IRBlock *pIVar2;
  CFGNode *pCVar3;
  pointer this_00;
  bool bVar4;
  bool bVar5;
  size_type sVar6;
  reference ppCVar7;
  __node_base_ptr *this_01;
  pointer pIVar8;
  mapped_type *pmVar9;
  __node_base *this_02;
  reference ppOVar10;
  vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_> *this_03;
  pointer pIVar11;
  IncomingValue *pIVar12;
  value_type local_1c0;
  UnorderedMap<spv::Id,_spv::Id> *local_1b0;
  value_type *remap_1;
  size_t n_1;
  size_t i_1;
  const_iterator local_190;
  uint32_t local_184;
  iterator iStack_180;
  Id incoming_from_node;
  pointer *local_178;
  IncomingValue *local_170;
  __normal_iterator<dxil_spv::IncomingValue_*,_std::vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>_>
  local_168;
  __normal_iterator<dxil_spv::IncomingValue_*,_std::vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>_>
  local_160;
  __normal_iterator<dxil_spv::IncomingValue_*,_std::vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>_>
  incoming_itr;
  PHI *phi_1;
  iterator __end2_2;
  iterator __begin2_2;
  Vector<PHI> *__range2_2;
  Operation *pOStack_130;
  bool done;
  Operation *local_128;
  Operation *op;
  iterator __end2_1;
  iterator __begin2_1;
  Vector<Operation_*> *__range2_1;
  __normal_iterator<const_dxil_spv::IncomingValue_*,_std::vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>_>
  local_100;
  const_iterator itr;
  PHI *phi;
  iterator __end2;
  iterator __begin2;
  Vector<PHI> *__range2;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_b8;
  CFGNode *local_98;
  CFGNode *block;
  value_type *remap;
  CFGNode *pred;
  size_t n;
  size_t i;
  Vector<CFGNode_*> tmp_pred;
  CFGNode *succ;
  undefined1 local_48 [8];
  Vector<CFGNode_*> break_blocks;
  Vector<UnorderedMap<spv::Id,_spv::Id>_> rewritten_ids;
  CFGNode *node_local;
  CFGStructurizer *this_local;
  
  rewritten_ids.
  super__Vector_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)node;
  std::
  vector<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
  ::vector((vector<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
            *)&break_blocks.
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar6 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
          size((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
               &rewritten_ids.
                super__Vector_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[5]._M_h._M_before_begin);
  if (sVar6 != 1) {
    __assert_fail("node->succ.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                  ,0x639,"void dxil_spv::CFGStructurizer::duplicate_node(CFGNode *)");
  }
  sVar6 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
          size((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
               &rewritten_ids.
                super__Vector_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[5]._M_h._M_rehash_policy.
                _M_next_resize);
  this_00 = rewritten_ids.
            super__Vector_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (sVar6 < 2) {
    __assert_fail("node->pred.size() >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                  ,0x63a,"void dxil_spv::CFGStructurizer::duplicate_node(CFGNode *)");
  }
  ppCVar7 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
            front((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   *)&rewritten_ids.
                      super__Vector_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage[5]._M_h._M_before_begin);
  bVar4 = CFGNode::dominates((CFGNode *)this_00,*ppCVar7);
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    __assert_fail("!node->dominates(node->succ.front())",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                  ,0x63b,"void dxil_spv::CFGStructurizer::duplicate_node(CFGNode *)");
  }
  sVar6 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
          size((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
               &rewritten_ids.
                super__Vector_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[5]._M_h._M_rehash_policy.
                _M_next_resize);
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::vector
            ((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
             local_48,sVar6,(allocator_type *)((long)&succ + 7));
  sVar6 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
          size((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
               &rewritten_ids.
                super__Vector_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[5]._M_h._M_rehash_policy.
                _M_next_resize);
  std::
  vector<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
  ::resize((vector<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
            *)&break_blocks.
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar6);
  ppCVar7 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
            front((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   *)&rewritten_ids.
                      super__Vector_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage[5]._M_h._M_before_begin);
  tmp_pred.
  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppCVar7;
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::vector
            ((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)&i
             ,(vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
              &rewritten_ids.
               super__Vector_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage[5]._M_h._M_rehash_policy.
               _M_next_resize);
  n = 0;
  pred = (CFGNode *)
         std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
         size((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
              &i);
  for (; n < pred; n = n + 1) {
    ppCVar7 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::operator[]((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            *)&i,n);
    remap = (value_type *)*ppCVar7;
    block = (CFGNode *)
            std::
            vector<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
            ::operator[]((vector<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
                          *)&break_blocks.
                             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,n);
    local_98 = CFGNodePool::create_node(this->pool);
    std::operator+((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    *)&__range2,
                   (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    *)rewritten_ids.
                      super__Vector_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,".dup.");
    std::operator+(&local_b8,
                   (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    *)&__range2,
                   (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    *)remap);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::operator=(&local_98->name,&local_b8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::~basic_string(&local_b8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::~basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                     *)&__range2);
    (local_98->ir).terminator.type = Branch;
    (local_98->ir).terminator.direct_block =
         (CFGNode *)
         tmp_pred.
         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98->immediate_post_dominator =
         (CFGNode *)
         tmp_pred.
         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98->immediate_dominator = (CFGNode *)remap;
    CFGNode::retarget_branch
              ((CFGNode *)remap,
               (CFGNode *)
               rewritten_ids.
               super__Vector_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,local_98);
    CFGNode::add_branch(local_98,(CFGNode *)
                                 tmp_pred.
                                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_01 = &((rewritten_ids.
                 super__Vector_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_h)._M_single_bucket;
    __end2 = std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::begin
                       ((vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_> *)
                        this_01);
    phi = (PHI *)std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::end
                           ((vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_> *
                            )this_01);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<dxil_spv::PHI_*,_std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>_>
                                       *)&phi), bVar4) {
      itr._M_current =
           (IncomingValue *)
           __gnu_cxx::
           __normal_iterator<dxil_spv::PHI_*,_std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>_>
           ::operator*(&__end2);
      local_100._M_current =
           (IncomingValue *)
           find_incoming_value((CFGNode *)remap,&((reference)itr._M_current)->incoming);
      __range2_1 = (Vector<Operation_*> *)
                   std::
                   vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                   ::end((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                          *)(itr._M_current + 1));
      bVar4 = __gnu_cxx::operator!=
                        (&local_100,
                         (__normal_iterator<dxil_spv::IncomingValue_*,_std::vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>_>
                          *)&__range2_1);
      if (!bVar4) {
        __assert_fail("itr != phi.incoming.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                      ,0x655,"void dxil_spv::CFGStructurizer::duplicate_node(CFGNode *)");
      }
      pIVar8 = __gnu_cxx::
               __normal_iterator<const_dxil_spv::IncomingValue_*,_std::vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>_>
               ::operator->(&local_100);
      uVar1 = pIVar8->id;
      pmVar9 = std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[]((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                             *)block,(key_type *)itr._M_current);
      *pmVar9 = uVar1;
      __gnu_cxx::
      __normal_iterator<dxil_spv::PHI_*,_std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>_>
      ::operator++(&__end2);
    }
    this_02 = &rewritten_ids.
               super__Vector_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage[1]._M_h._M_before_begin;
    __end2_1 = std::
               vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
               ::begin((vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                        *)this_02);
    op = (Operation *)
         std::vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
         ::end((vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                *)this_02);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<dxil_spv::Operation_**,_std::vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>_>
                               *)&op), pCVar3 = local_98, bVar4) {
      ppOVar10 = __gnu_cxx::
                 __normal_iterator<dxil_spv::Operation_**,_std::vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>_>
                 ::operator*(&__end2_1);
      local_128 = *ppOVar10;
      pIVar2 = &local_98->ir;
      pOStack_130 = duplicate_op(this,local_128,(UnorderedMap<spv::Id,_spv::Id> *)block);
      std::vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>::
      push_back(&pIVar2->operations,&stack0xfffffffffffffed0);
      __gnu_cxx::
      __normal_iterator<dxil_spv::Operation_**,_std::vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>_>
      ::operator++(&__end2_1);
    }
    ppCVar7 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::operator[]((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            *)local_48,n);
    *ppCVar7 = pCVar3;
  }
  bVar4 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
          empty((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *
                )&rewritten_ids.
                  super__Vector_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage[5]._M_h._M_rehash_policy.
                  _M_next_resize);
  if (bVar4) {
    while (tmp_pred.
           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      bVar4 = false;
      this_03 = (vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_> *)
                (tmp_pred.
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 6);
      __end2_2 = std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::begin
                           (this_03);
      phi_1 = (PHI *)std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::end
                               (this_03);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end2_2,
                                (__normal_iterator<dxil_spv::PHI_*,_std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>_>
                                 *)&phi_1), bVar5) {
        incoming_itr._M_current =
             (IncomingValue *)
             __gnu_cxx::
             __normal_iterator<dxil_spv::PHI_*,_std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>_>
             ::operator*(&__end2_2);
        local_168._M_current =
             (IncomingValue *)
             std::
             vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
             ::begin(&((reference)incoming_itr._M_current)->incoming);
        local_170 = (IncomingValue *)
                    std::
                    vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                    ::end((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                           *)(incoming_itr._M_current + 1));
        local_178 = &rewritten_ids.
                     super__Vector_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_160 = std::
                    find_if<__gnu_cxx::__normal_iterator<dxil_spv::IncomingValue*,std::vector<dxil_spv::IncomingValue,dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>>>,dxil_spv::CFGStructurizer::duplicate_node(dxil_spv::CFGNode*)::__0>
                              (local_168,
                               (__normal_iterator<dxil_spv::IncomingValue_*,_std::vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>_>
                                )local_170,(anon_class_8_1_898f5b00_for__M_pred)local_178);
        iStack_180 = std::
                     vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                     ::end(incoming_itr._M_current + 1);
        bVar5 = __gnu_cxx::operator!=(&local_160,&stack0xfffffffffffffe80);
        if (bVar5) {
          pIVar11 = __gnu_cxx::
                    __normal_iterator<dxil_spv::IncomingValue_*,_std::vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>_>
                    ::operator->(&local_160);
          local_184 = pIVar11->id;
          pIVar12 = incoming_itr._M_current + 1;
          __gnu_cxx::
          __normal_iterator<dxil_spv::IncomingValue_const*,std::vector<dxil_spv::IncomingValue,dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>>>
          ::__normal_iterator<dxil_spv::IncomingValue*>
                    ((__normal_iterator<dxil_spv::IncomingValue_const*,std::vector<dxil_spv::IncomingValue,dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>>>
                      *)&local_190,&local_160);
          i_1 = (size_t)std::
                        vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                        ::erase((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                                 *)pIVar12,local_190);
          n_1 = 0;
          remap_1 = (value_type *)
                    std::
                    vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ::size((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            *)&i);
          for (; n_1 < remap_1; n_1 = n_1 + 1) {
            local_1b0 = std::
                        vector<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
                        ::operator[]((vector<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
                                      *)&break_blocks.
                                         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,n_1);
            pIVar12 = incoming_itr._M_current + 1;
            ppCVar7 = std::
                      vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ::operator[]((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                    *)local_48,n_1);
            local_1c0.block = *ppCVar7;
            local_1c0.id = get_remapped_id_for_duplicated_block(local_184,local_1b0);
            std::
            vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
            ::push_back((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                         *)pIVar12,&local_1c0);
          }
          bVar4 = true;
        }
        __gnu_cxx::
        __normal_iterator<dxil_spv::PHI_*,_std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>_>
        ::operator++(&__end2_2);
      }
      if ((bVar4) ||
         (sVar6 = std::
                  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ::size((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                          *)(tmp_pred.
                             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x25)), sVar6 != 1
         )) {
        tmp_pred.
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      else {
        ppCVar7 = std::
                  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ::front((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                           *)(tmp_pred.
                              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x25));
        tmp_pred.
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppCVar7;
      }
    }
    std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::~vector
              ((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
               &i);
    std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::~vector
              ((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
               local_48);
    std::
    vector<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
    ::~vector((vector<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_dxil_spv::ThreadLocalAllocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
               *)&break_blocks.
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return;
  }
  __assert_fail("node->pred.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                ,0x65f,"void dxil_spv::CFGStructurizer::duplicate_node(CFGNode *)");
}

Assistant:

void CFGStructurizer::duplicate_node(CFGNode *node)
{
	Vector<UnorderedMap<spv::Id, spv::Id>> rewritten_ids;
	assert(node->succ.size() == 1);
	assert(node->pred.size() >= 2);
	assert(!node->dominates(node->succ.front()));

	Vector<CFGNode *> break_blocks(node->pred.size());
	rewritten_ids.resize(node->pred.size());
	auto *succ = node->succ.front();

	auto tmp_pred = node->pred;
	for (size_t i = 0, n = tmp_pred.size(); i < n; i++)
	{
		auto *pred = tmp_pred[i];
		auto &remap = rewritten_ids[i];

		// First, rewrite PHI inputs.
		// Since we only have one pred now, we can resolve PHIs directly.
		auto *block = pool.create_node();
		block->name = node->name + ".dup." + pred->name;
		block->ir.terminator.type = Terminator::Type::Branch;
		block->ir.terminator.direct_block = succ;
		block->immediate_post_dominator = succ;
		block->immediate_dominator = pred;
		pred->retarget_branch(node, block);
		block->add_branch(succ);

		for (auto &phi : node->ir.phi)
		{
			auto itr = find_incoming_value(pred, phi.incoming);
			assert(itr != phi.incoming.end());
			remap[phi.id] = itr->id;
		}

		for (auto *op : node->ir.operations)
			block->ir.operations.push_back(duplicate_op(op, remap));

		break_blocks[i] = block;
	}

	assert(node->pred.empty());

	// Finally, look at succ. If it takes PHI inputs from node, we'll have to rewrite the PHIs.
	// We know that node does not dominate succ,
	// so succ cannot use any SSA variables node generated directly
	// without using PHI nodes.

	// We might have placed ladders in between so that we need to fixup PHI later than just plain succ.
	// Chase down the chain and replace all PHIs.

	while (succ)
	{
		bool done = false;
		for (auto &phi : succ->ir.phi)
		{
			// Find incoming ID from the block we're splitting up.
			auto incoming_itr = std::find_if(phi.incoming.begin(), phi.incoming.end(), [&](const IncomingValue &incoming) {
				return incoming.block == node;
			});

			if (incoming_itr != phi.incoming.end())
			{
				spv::Id incoming_from_node = incoming_itr->id;
				phi.incoming.erase(incoming_itr);

				for (size_t i = 0, n = tmp_pred.size(); i < n; i++)
				{
					auto &remap = rewritten_ids[i];
					phi.incoming.push_back({ break_blocks[i], get_remapped_id_for_duplicated_block(incoming_from_node, remap) });
				}

				// We've found the block we wanted to rewrite, terminate loop now.
				done = true;
			}
		}

		if (!done && succ->succ.size() == 1)
			succ = succ->succ.front();
		else
			succ = nullptr;
	}
}